

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O0

MPP_RET vepu541_set_roi(void *buf,MppEncROICfg *roi,RK_S32 w,RK_S32 h)

{
  uint local_54;
  MPP_RET local_50;
  RK_S32 i;
  MPP_RET ret;
  Vepu541RoiCfg cfg;
  RK_S32 stride_v;
  RK_S32 stride_h;
  RK_S32 mb_h;
  RK_S32 mb_w;
  Vepu541RoiCfg *ptr;
  MppEncROIRegion *region;
  RK_S32 h_local;
  RK_S32 w_local;
  MppEncROICfg *roi_local;
  void *buf_local;
  
  ptr = (Vepu541RoiCfg *)roi->regions;
  local_50 = MPP_NOK;
  if ((buf == (void *)0x0) || (roi == (MppEncROICfg *)0x0)) {
    _mpp_log_l(2,"vepu541_common","invalid buf %p roi %p\n","vepu541_set_roi",buf,roi);
  }
  else {
    _mb_h = (undefined2 *)buf;
    for (local_54 = 0;
        (int)local_54 <
        (int)(((int)((long)((long)(w + 0xf) & 0xfffffffffffffff0U) / 0x10) + 3U & 0xfffffffc) *
             ((int)((long)((long)(h + 0xf) & 0xfffffffffffffff0U) / 0x10) + 3U & 0xfffffffc));
        local_54 = local_54 + 1) {
      *_mb_h = 0x80;
      _mb_h = _mb_h + 1;
    }
    if ((w < 1) || (h < 1)) {
      _mpp_log_l(2,"vepu541_common","invalid size [%d:%d]\n","vepu541_set_roi",(ulong)(uint)w,
                 (ulong)(uint)h);
    }
    else if (roi->number < 9) {
      local_50 = MPP_OK;
      for (local_54 = 0; (int)local_54 < (int)roi->number; local_54 = local_54 + 1) {
        if ((w < (int)((uint)(ushort)*ptr + (uint)(ushort)ptr[2])) ||
           (h < (int)((uint)(ushort)ptr[1] + (uint)(ushort)ptr[3]))) {
          local_50 = MPP_NOK;
        }
        if ((((1 < (ushort)ptr[4]) || (7 < (ushort)ptr[6])) || (1 < *(byte *)(ptr + 7))) ||
           (1 < (byte)ptr[7].field_0x1)) {
          local_50 = MPP_NOK;
        }
        if (((ptr[7].field_0x1 != '\0') && (0x33 < (short)ptr[5])) ||
           ((ptr[7].field_0x1 == '\0' && ((0x33 < (short)ptr[5] || ((short)ptr[5] < -0x33)))))) {
          local_50 = MPP_NOK;
        }
        if (local_50 != MPP_OK) {
          _mpp_log_l(2,"vepu541_common","region %d invalid param:\n","vepu541_set_roi",
                     (ulong)local_54);
          _mpp_log_l(2,"vepu541_common","position [%d:%d:%d:%d] vs [%d:%d]\n","vepu541_set_roi",
                     (ulong)(ushort)*ptr,(ulong)(ushort)ptr[1],(uint)(ushort)ptr[2],
                     (uint)(ushort)ptr[3],w,h);
          _mpp_log_l(2,"vepu541_common","force intra %d qp area index %d\n","vepu541_set_roi",
                     (ulong)(ushort)ptr[4],(ulong)(ushort)ptr[6]);
          _mpp_log_l(2,"vepu541_common","abs qp mode %d value %d\n","vepu541_set_roi",
                     (ulong)(byte)ptr[7].field_0x1,(ulong)(uint)(int)(short)ptr[5]);
          return local_50;
        }
        ptr = ptr + 8;
      }
      ptr = (Vepu541RoiCfg *)roi->regions;
      for (local_54 = 0; (int)local_54 < (int)roi->number; local_54 = local_54 + 1) {
        vepu541_set_one_roi(buf,(MppEncROIRegion *)ptr,w,h);
        ptr = ptr + 8;
      }
    }
    else {
      _mpp_log_l(2,"vepu541_common","invalid region number %d\n","vepu541_set_roi",
                 (ulong)roi->number);
    }
  }
  return local_50;
}

Assistant:

MPP_RET vepu541_set_roi(void *buf, MppEncROICfg *roi, RK_S32 w, RK_S32 h)
{
    MppEncROIRegion *region = roi->regions;
    Vepu541RoiCfg *ptr = (Vepu541RoiCfg *)buf;
    RK_S32 mb_w = MPP_ALIGN(w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    RK_S32 stride_v = MPP_ALIGN(mb_h, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;
    RK_S32 i;

    if (NULL == buf || NULL == roi) {
        mpp_err_f("invalid buf %p roi %p\n", buf, roi);
        goto DONE;
    }

    cfg.force_intra = 0;
    cfg.reserved    = 0;
    cfg.qp_area_idx = 0;
    cfg.qp_area_en  = 1;
    cfg.qp_adj      = 0;
    cfg.qp_adj_mode = 0;

    /* step 1. reset all the config */
    for (i = 0; i < stride_h * stride_v; i++, ptr++)
        memcpy(ptr, &cfg, sizeof(cfg));

    if (w <= 0 || h <= 0) {
        mpp_err_f("invalid size [%d:%d]\n", w, h);
        goto DONE;
    }

    if (roi->number > VEPU541_MAX_ROI_NUM) {
        mpp_err_f("invalid region number %d\n", roi->number);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < (RK_S32)roi->number; i++, region++) {
        if (region->x + region->w > w || region->y + region->h > h)
            ret = MPP_NOK;

        if (region->intra > 1 || region->qp_area_idx >= VEPU541_MAX_ROI_NUM ||
            region->area_map_en > 1 || region->abs_qp_en > 1)
            ret = MPP_NOK;

        if ((region->abs_qp_en && region->quality > 51) ||
            (!region->abs_qp_en && (region->quality > 51 || region->quality < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, w, h);
            mpp_err_f("force intra %d qp area index %d\n",
                      region->intra, region->qp_area_idx);
            mpp_err_f("abs qp mode %d value %d\n",
                      region->abs_qp_en, region->quality);
            goto DONE;
        }
    }

    region = roi->regions;
    /* step 2. setup region for top to bottom */
    for (i = 0; i < (RK_S32)roi->number; i++, region++) {
        vepu541_set_one_roi(buf, region, w, h);
    }

DONE:
    return ret;
}